

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int moveToChild(BtCursor *pCur,u32 newPgno)

{
  char cVar1;
  BtShared *pBt;
  int iVar2;
  long lVar3;
  
  cVar1 = pCur->iPage;
  lVar3 = (long)cVar1;
  if (0x12 < lVar3) {
    iVar2 = sqlite3CorruptError(0xfba2);
    return iVar2;
  }
  pBt = pCur->pBt;
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf9;
  pCur->iPage = cVar1 + '\x01';
  pCur->aiIdx[lVar3] = pCur->ix;
  pCur->ix = 0;
  iVar2 = getAndInitPage(pBt,newPgno,pCur->apPage + lVar3 + 1,pCur,(uint)pCur->curPagerFlags);
  return iVar2;
}

Assistant:

static int moveToChild(BtCursor *pCur, u32 newPgno){
  BtShared *pBt = pCur->pBt;

  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->iPage<BTCURSOR_MAX_DEPTH );
  assert( pCur->iPage>=0 );
  if( pCur->iPage>=(BTCURSOR_MAX_DEPTH-1) ){
    return SQLITE_CORRUPT_BKPT;
  }
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  pCur->aiIdx[pCur->iPage++] = pCur->ix;
  pCur->ix = 0;
  return getAndInitPage(pBt, newPgno, &pCur->apPage[pCur->iPage],
                        pCur, pCur->curPagerFlags);
}